

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_bit(bitstream *str,uint32_t *val)

{
  int iVar1;
  uint *in_RSI;
  int *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RDI == 0) {
    *(byte *)(in_RDI + 6) = *(byte *)(in_RDI + 6) | (byte)(*in_RSI << ((byte)in_RDI[7] & 0x1f));
    if (in_RDI[7] == 0) {
      iVar1 = vs_byte((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      in_RDI[7] = in_RDI[7] + -1;
    }
  }
  else {
    if ((in_RDI[0xc] == 0) &&
       (iVar1 = vs_byte((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
       iVar1 != 0)) {
      return 1;
    }
    *in_RSI = (int)(uint)*(byte *)(in_RDI + 6) >> ((byte)in_RDI[7] & 0x1f) & 1;
    if (in_RDI[7] == 0) {
      in_RDI[0xc] = 0;
      in_RDI[7] = 7;
    }
    else {
      in_RDI[7] = in_RDI[7] + -1;
    }
  }
  if (*in_RSI == 0) {
    in_RDI[10] = in_RDI[10] + 1;
  }
  else {
    in_RDI[10] = 0;
  }
  return 0;
}

Assistant:

int vs_bit(struct bitstream *str, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		str->curbyte |= *val << str->bitpos;
		if (!str->bitpos) {
			if (vs_byte(str))
				return 1;
		} else {
			str->bitpos--;
		}
	} else {
		if (!str->hasbyte) {
			if (vs_byte(str))
				return 1;
		}
		*val = str->curbyte >> str->bitpos & 1;
		if (!str->bitpos) {
			str->hasbyte = 0;
			str->bitpos = 7;
		} else {
			str->bitpos--;
		}
	}
	if (!*val) {
		str->zero_bits++;
	} else {
		str->zero_bits = 0;
	}
	return 0;
}